

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_19b94e7::GLEnvInfo::GLEnvInfo(GLEnvInfo *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  QOpenGLContext *this_00;
  QOpenGLFunctions *pQVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->glversion).d.d = (Data *)0x0;
  (this->glversion).d.ptr = (char *)0x0;
  (this->glrenderer).d.ptr = (char *)0x0;
  (this->glrenderer).d.size = 0;
  (this->glvendor).d.size = 0;
  (this->glrenderer).d.d = (Data *)0x0;
  (this->glvendor).d.d = (Data *)0x0;
  (this->glvendor).d.ptr = (char *)0x0;
  (this->glversion).d.size = 0;
  this_00 = QOpenGLContext::currentContext();
  pQVar3 = QOpenGLContext::functions(this_00);
  pcVar4 = (char *)(*(pQVar3->d_ptr->field_0).functions[0x1a])(0x1f00);
  pcVar5 = (char *)(*(pQVar3->d_ptr->field_0).functions[0x1a])(0x1f01);
  pcVar6 = (char *)(*(pQVar3->d_ptr->field_0).functions[0x1a])(0x1f02);
  if (pcVar4 != (char *)0x0) {
    QByteArray::QByteArray((QByteArray *)&local_48,pcVar4,-1);
    pDVar2 = (this->glvendor).d.d;
    pcVar4 = (this->glvendor).d.ptr;
    (this->glvendor).d.d = local_48.d;
    (this->glvendor).d.ptr = local_48.ptr;
    qVar1 = (this->glvendor).d.size;
    (this->glvendor).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar4;
    local_48.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (pcVar5 != (char *)0x0) {
    QByteArray::QByteArray((QByteArray *)&local_48,pcVar5,-1);
    pDVar2 = (this->glrenderer).d.d;
    pcVar4 = (this->glrenderer).d.ptr;
    (this->glrenderer).d.d = local_48.d;
    (this->glrenderer).d.ptr = local_48.ptr;
    qVar1 = (this->glrenderer).d.size;
    (this->glrenderer).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar4;
    local_48.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (pcVar6 != (char *)0x0) {
    QByteArray::QByteArray((QByteArray *)&local_48,pcVar6,-1);
    pDVar2 = (this->glversion).d.d;
    pcVar4 = (this->glversion).d.ptr;
    (this->glversion).d.d = local_48.d;
    (this->glversion).d.ptr = local_48.ptr;
    qVar1 = (this->glversion).d.size;
    (this->glversion).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar4;
    local_48.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

GLEnvInfo::GLEnvInfo()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    Q_ASSERT(ctx);
    QOpenGLFunctions *f = ctx->functions();
    const char *vendor = reinterpret_cast<const char *>(f->glGetString(GL_VENDOR));
    const char *renderer = reinterpret_cast<const char *>(f->glGetString(GL_RENDERER));
    const char *version = reinterpret_cast<const char *>(f->glGetString(GL_VERSION));
    if (vendor)
        glvendor = QByteArray(vendor);
    if (renderer)
        glrenderer = QByteArray(renderer);
    if (version)
        glversion = QByteArray(version);
}